

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::QuadRegion::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          QuadRegion *this,Vector3d *position)

{
  double dVar1;
  bool bVar2;
  reference_type pdVar3;
  CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::SingleRange>_>
  *pCVar4;
  Scalar SVar5;
  optional<double> oVar6;
  RealScalar local_1d8;
  undefined4 local_1d0;
  non_const_type local_1c8;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_1c0;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_1b0;
  double local_198;
  double local_190;
  double local_188;
  double local_180 [3];
  type local_168;
  CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::SingleRange>_>
  local_148;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_128 [16];
  undefined1 local_118 [8];
  VectorXd pvs;
  Matrix<double,_3,_3,_0,_3,_3> local_100;
  Matrix<double,_3,_1,_0,_3,_1> local_b8;
  undefined1 local_a0 [8];
  optional<double> y;
  Matrix<double,_3,_1,_0,_3,_1> local_48;
  undefined1 local_30 [8];
  optional<double> x;
  Vector3d *position_local;
  QuadRegion *this_local;
  
  x.super_type.m_storage = (double)position;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_48,position);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)&y.super_type.m_storage,&this->_polyBasisX);
  oVar6 = _pan(this,&local_48,(Matrix3d *)&y.super_type.m_storage);
  x.super_type._0_8_ = oVar6.super_type.m_storage;
  local_30[0] = oVar6.super_type.m_initialized;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_b8,position);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&local_100,&this->_polyBasisY);
  oVar6 = _pan(this,&local_b8,&local_100);
  y.super_type._0_8_ = oVar6.super_type.m_storage;
  local_a0[0] = oVar6.super_type.m_initialized;
  bVar2 = boost::operator==(local_30);
  if ((!bVar2) && (bVar2 = boost::operator==(local_a0), !bVar2)) {
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::Zero();
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>>>
              ((Matrix<double,_1,1,0,_1,1> *)local_118,local_128);
    Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator()
              (&local_168,(DenseBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_118,&this->_order);
    pdVar3 = boost::optional<double>::get((optional<double> *)local_30);
    dVar1 = *pdVar3;
    pdVar3 = boost::optional<double>::get((optional<double> *)local_a0);
    local_180[0] = (1.0 - dVar1) * (1.0 - *pdVar3);
    Eigen::
    DenseBase<Eigen::IndexedView<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::SingleRange>_>
    ::operator<<(&local_148,
                 (DenseBase<Eigen::IndexedView<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::SingleRange>_>
                  *)&local_168,local_180);
    pdVar3 = boost::optional<double>::get((optional<double> *)local_30);
    dVar1 = *pdVar3;
    pdVar3 = boost::optional<double>::get((optional<double> *)local_a0);
    local_188 = dVar1 * (1.0 - *pdVar3);
    pCVar4 = Eigen::
             CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::SingleRange>_>
             ::operator_(&local_148,&local_188);
    pdVar3 = boost::optional<double>::get((optional<double> *)local_30);
    dVar1 = *pdVar3;
    pdVar3 = boost::optional<double>::get((optional<double> *)local_a0);
    local_190 = dVar1 * *pdVar3;
    pCVar4 = Eigen::
             CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::SingleRange>_>
             ::operator_(pCVar4,&local_190);
    pdVar3 = boost::optional<double>::get((optional<double> *)local_30);
    dVar1 = *pdVar3;
    pdVar3 = boost::optional<double>::get((optional<double> *)local_a0);
    local_198 = (1.0 - dVar1) * *pdVar3;
    Eigen::
    CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::SingleRange>_>
    ::operator_(pCVar4,&local_198);
    Eigen::
    CommaInitializer<Eigen::IndexedView<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::SingleRange>_>
    ::~CommaInitializer(&local_148);
    Eigen::
    IndexedView<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::SingleRange>
    ::~IndexedView(&local_168);
    local_1c8 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_118);
    local_1c0 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator*
                          ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>> *)
                           &local_1c8,
                           (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           &(this->super_RegionHandler)._positions);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
    ::operator*(&local_1b0,
                (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                 *)&local_1c0,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)position);
    SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_1b0);
    if (0.0 < SVar5) {
      local_1d8 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_118);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_118,&local_1d8);
      boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::optional
                (__return_storage_ptr__,(rval_reference_type)local_118);
    }
    else {
      boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::optional(__return_storage_ptr__);
    }
    local_1d0 = 1;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_118);
    return __return_storage_ptr__;
  }
  boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::optional(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Eigen::VectorXd> QuadRegion::handle(
      Eigen::Vector3d position) const {
    boost::optional<double> x = _pan(position, _polyBasisX);
    boost::optional<double> y = _pan(position, _polyBasisY);

    if (x == boost::none || y == boost::none) {
      return boost::none;
    }

    Eigen::VectorXd pvs = Eigen::Vector4d::Zero();
    pvs(_order) << (1 - x.get()) * (1 - y.get()), x.get() * (1 - y.get()),
        x.get() * y.get(), (1 - x.get()) * y.get();
    if ((pvs.transpose() * _positions) * position <= 0) {
      return boost::none;
    }
    pvs /= pvs.norm();
    return pvs;
  }